

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btRotationalLimitMotor2::testLimitValue(btRotationalLimitMotor2 *this,btScalar test_value)

{
  btScalar test_value_local;
  btRotationalLimitMotor2 *this_local;
  
  if (this->m_loLimit < this->m_hiLimit || this->m_loLimit == this->m_hiLimit) {
    if ((this->m_loLimit != this->m_hiLimit) || (NAN(this->m_loLimit) || NAN(this->m_hiLimit))) {
      this->m_currentLimitError = test_value - this->m_loLimit;
      this->m_currentLimitErrorHi = test_value - this->m_hiLimit;
      this->m_currentLimit = 4;
    }
    else {
      this->m_currentLimitError = test_value - this->m_loLimit;
      this->m_currentLimit = 3;
    }
  }
  else {
    this->m_currentLimit = 0;
    this->m_currentLimitError = 0.0;
  }
  return;
}

Assistant:

void btRotationalLimitMotor2::testLimitValue(btScalar test_value)
{
	//we can't normalize the angles here because we would lost the sign that we use later, but it doesn't seem to be a problem
	if(m_loLimit > m_hiLimit) {
		m_currentLimit = 0;
		m_currentLimitError = btScalar(0.f);
	}
	else if(m_loLimit == m_hiLimit) {
		m_currentLimitError = test_value - m_loLimit;
		m_currentLimit = 3;
	} else {
		m_currentLimitError = test_value - m_loLimit;
		m_currentLimitErrorHi = test_value - m_hiLimit;
		m_currentLimit = 4;
	}
}